

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_setNumChips(ADL_MIDIPlayer *device,int numChips)

{
  MIDIplay *this;
  bool bVar1;
  int iVar2;
  OPL3 *this_00;
  Synth *synth;
  int maxFourOps;
  allocator local_49;
  string local_48;
  MIDIplay *local_28;
  MidiPlayer *play;
  ADL_MIDIPlayer *pAStack_18;
  int numChips_local;
  ADL_MIDIPlayer *device_local;
  
  if (device == (ADL_MIDIPlayer *)0x0) {
    device_local._4_4_ = -2;
  }
  else {
    this = (MIDIplay *)device->adl_midiPlayer;
    local_28 = this;
    play._4_4_ = numChips;
    pAStack_18 = device;
    if (this == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x86,"int adl_setNumChips(ADL_MIDIPlayer *, int)");
    }
    (this->m_setup).numChips = numChips;
    if (((this->m_setup).numChips == 0) || (100 < (this->m_setup).numChips)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"number of chips may only be 1..100.\n",&local_49);
      MIDIplay::setErrorString(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      device_local._4_4_ = -1;
    }
    else {
      iVar2 = (this->m_setup).numChips * 6;
      if (iVar2 < (this->m_setup).numFourOps) {
        (this->m_setup).numFourOps = iVar2;
      }
      else if ((this->m_setup).numFourOps < -1) {
        (this->m_setup).numFourOps = -1;
      }
      this_00 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*(&this->m_synth);
      bVar1 = OPL3::setupLocked(this_00);
      if (bVar1) {
        device_local._4_4_ = 0;
      }
      else {
        this_00->m_numChips = (local_28->m_setup).numChips;
        if ((local_28->m_setup).numFourOps < 0) {
          adlCalculateFourOpChannels(local_28,true);
        }
        else {
          this_00->m_numFourOps = (local_28->m_setup).numFourOps;
        }
        MIDIplay::partialReset(local_28);
        device_local._4_4_ = 0;
      }
    }
  }
  return device_local._4_4_;
}

Assistant:

ADLMIDI_EXPORT int adl_setNumChips(ADL_MIDIPlayer *device, int numChips)
{
    if(device == NULL)
        return -2;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);

#ifdef ADLMIDI_ENABLE_HW_SERIAL
    if(play->m_setup.serial)
        numChips = 1;
#endif

#ifdef ADLMIDI_HW_OPL
    play->m_setup.numChips = numChips > 2 ? 1 : static_cast<unsigned int>(numChips);
#else
    play->m_setup.numChips = static_cast<unsigned int>(numChips);
#endif

    if((play->m_setup.numChips < 1) || (play->m_setup.numChips > ADL_MAX_CHIPS))
    {
        play->setErrorString("number of chips may only be 1.." ADL_MAX_CHIPS_STR ".\n");
        return -1;
    }

    int maxFourOps = static_cast<int>(play->m_setup.numChips * 6);

    if(play->m_setup.numFourOps > maxFourOps)
        play->m_setup.numFourOps = maxFourOps;
    else if(play->m_setup.numFourOps < -1)
        play->m_setup.numFourOps = -1;

    Synth &synth = *play->m_synth;
    if(!synth.setupLocked())
    {
        synth.m_numChips = play->m_setup.numChips;
        if(play->m_setup.numFourOps < 0)
            adlCalculateFourOpChannels(play, true);
        else
            synth.m_numFourOps = static_cast<uint32_t>(play->m_setup.numFourOps);
        play->partialReset();
        return 0;
    }

    return 0;
}